

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4153d9::ParameterPackExpansion::printLeft
          (ParameterPackExpansion *this,OutputStream *S)

{
  uint uVar1;
  Node *pNVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  
  uVar4 = S->CurrentPackIndex;
  uVar5 = S->CurrentPackMax;
  S->CurrentPackIndex = 0xffffffff;
  S->CurrentPackMax = 0xffffffff;
  sVar7 = S->CurrentPosition;
  pNVar2 = this->Child;
  (*pNVar2->_vptr_Node[4])(pNVar2);
  if (pNVar2->RHSComponentCache != No) {
    (*pNVar2->_vptr_Node[5])(pNVar2,S);
  }
  uVar1 = S->CurrentPackMax;
  if (uVar1 == 0xffffffff) {
    OutputStream::grow(S,3);
    pcVar3 = S->Buffer;
    sVar7 = S->CurrentPosition;
    pcVar3[sVar7 + 2] = '.';
    pcVar3 = pcVar3 + sVar7;
    pcVar3[0] = '.';
    pcVar3[1] = '.';
    sVar7 = S->CurrentPosition + 3;
  }
  else if (uVar1 != 0) {
    if (1 < uVar1) {
      uVar6 = 1;
      do {
        OutputStream::grow(S,2);
        pcVar3 = S->Buffer;
        sVar7 = S->CurrentPosition;
        (pcVar3 + sVar7)[0] = ',';
        (pcVar3 + sVar7)[1] = ' ';
        S->CurrentPosition = S->CurrentPosition + 2;
        S->CurrentPackIndex = uVar6;
        pNVar2 = this->Child;
        (*pNVar2->_vptr_Node[4])(pNVar2,S);
        if (pNVar2->RHSComponentCache != No) {
          (*pNVar2->_vptr_Node[5])(pNVar2,S);
        }
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
    goto LAB_0019846d;
  }
  S->CurrentPosition = sVar7;
LAB_0019846d:
  S->CurrentPackIndex = uVar4;
  S->CurrentPackMax = uVar5;
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    constexpr unsigned Max = std::numeric_limits<unsigned>::max();
    SwapAndRestore<unsigned> SavePackIdx(S.CurrentPackIndex, Max);
    SwapAndRestore<unsigned> SavePackMax(S.CurrentPackMax, Max);
    size_t StreamPos = S.getCurrentPosition();

    // Print the first element in the pack. If Child contains a ParameterPack,
    // it will set up S.CurrentPackMax and print the first element.
    Child->print(S);

    // No ParameterPack was found in Child. This can occur if we've found a pack
    // expansion on a <function-param>.
    if (S.CurrentPackMax == Max) {
      S += "...";
      return;
    }

    // We found a ParameterPack, but it has no elements. Erase whatever we may
    // of printed.
    if (S.CurrentPackMax == 0) {
      S.setCurrentPosition(StreamPos);
      return;
    }

    // Else, iterate through the rest of the elements in the pack.
    for (unsigned I = 1, E = S.CurrentPackMax; I < E; ++I) {
      S += ", ";
      S.CurrentPackIndex = I;
      Child->print(S);
    }
  }